

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O0

bool Js::VarIs<Js::JavascriptFunction,Js::DynamicObject>(DynamicObject *obj)

{
  bool bVar1;
  DynamicObject *obj_local;
  
  bVar1 = VarIsImpl<Js::JavascriptFunction>(&obj->super_RecyclableObject);
  return bVar1;
}

Assistant:

bool VarIs(U* obj)
    {
        // ChakraFull can't include type_traits, but ChakraCore does include it for debug builds
#if DBG && !defined(NTBUILD)
        static_assert(!std::is_same<T, U>::value, "Check should be unnecessary - did you prematurely cast?");
        static_assert(std::is_base_of<U, T>::value, "VarIs/VarTo should only downcast!");
#endif
        return VarIsImpl<T>(obj);
    }